

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O2

ACT_NODE_t * node_create_next(ACT_NODE_t *nod,AC_ALPHABET_t alpha)

{
  ACT_NODE_t *pAVar1;
  
  pAVar1 = node_find_next(nod,alpha);
  if (pAVar1 == (ACT_NODE_t *)0x0) {
    pAVar1 = node_create(nod->trie);
    node_add_edge(nod,pAVar1,alpha);
  }
  else {
    pAVar1 = (ACT_NODE_t *)0x0;
  }
  return pAVar1;
}

Assistant:

ACT_NODE_t *node_create_next (ACT_NODE_t *nod, AC_ALPHABET_t alpha)
{
    ACT_NODE_t *next;
    
    if (node_find_next (nod, alpha) != NULL)
        /* The edge already exists */
        return NULL;
    
    next = node_create (nod->trie);
    node_add_edge (nod, next, alpha);
    
    return next;
}